

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

void __thiscall
pbrt::PiecewiseConstant1D::PiecewiseConstant1D
          (PiecewiseConstant1D *this,span<const_float> f,Float min,Float max,Allocator alloc)

{
  size_t count;
  size_t sVar1;
  float *pfVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__range2;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM4 [64];
  undefined1 in_XMM5 [16];
  Float vb;
  Float va;
  undefined4 uStack_3c;
  Float local_38;
  Float local_34;
  
  auVar10 = in_ZMM4._0_16_;
  sVar5 = f.n;
  _va = alloc.memoryResource;
  local_38 = min;
  local_34 = max;
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            ((vector<float,pstd::pmr::polymorphic_allocator<float>> *)this,f.ptr,f.ptr + sVar5,
             (polymorphic_allocator<float> *)&va);
  count = sVar5 + 1;
  _va = alloc.memoryResource;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&this->cdf,count,(polymorphic_allocator<float> *)&va);
  this->min = local_38;
  this->max = local_34;
  this->funcInt = 0.0;
  va = local_34;
  vb = local_38;
  if (local_34 <= local_38) {
    LogFatal<char_const(&)[4],char_const(&)[4],char_const(&)[4],float&,char_const(&)[4],float&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.h"
               ,0x29f,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])0x7b84e0,
               (char (*) [4])0x7b84d2,(char (*) [4])0x7b84e0,(float *)&va,(char (*) [4])0x7b84d2,&vb
              );
  }
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  sVar1 = (this->func).nStored;
  pfVar2 = (this->func).ptr;
  for (lVar6 = 0; sVar1 << 2 != lVar6; lVar6 = lVar6 + 4) {
    auVar4 = vandps_avx(ZEXT416(*(uint *)((long)pfVar2 + lVar6)),auVar8);
    *(int *)((long)pfVar2 + lVar6) = auVar4._0_4_;
  }
  pfVar3 = (this->cdf).ptr;
  auVar10 = vcvtusi2ss_avx512f(auVar10,sVar5);
  *pfVar3 = 0.0;
  uVar7 = 1;
  fVar9 = 0.0;
  while( true ) {
    if (count <= uVar7) {
      fVar9 = pfVar3[sVar5];
      this->funcInt = fVar9;
      uVar7 = 1;
      if ((fVar9 != 0.0) || (NAN(fVar9))) {
        for (; uVar7 < count; uVar7 = uVar7 + 1) {
          pfVar3[uVar7] = pfVar3[uVar7] / this->funcInt;
        }
      }
      else {
        for (; uVar7 < count; uVar7 = uVar7 + 1) {
          auVar8 = vcvtusi2ss_avx512f(in_XMM5,uVar7);
          pfVar3[uVar7] = auVar8._0_4_ / auVar10._0_4_;
        }
      }
      return;
    }
    va = pfVar2[uVar7 - 1];
    vb = 0.0;
    if (va < 0.0) break;
    fVar9 = fVar9 + ((local_34 - local_38) * va) / auVar10._0_4_;
    pfVar3[uVar7] = fVar9;
    uVar7 = uVar7 + 1;
  }
  LogFatal<char_const(&)[12],char_const(&)[2],char_const(&)[12],float&,char_const(&)[2],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.h"
             ,0x2a8,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [12])"func[i - 1]",
             (char (*) [2])0x2c714a2,(char (*) [12])"func[i - 1]",(float *)&va,
             (char (*) [2])0x2c714a2,(int *)&vb);
}

Assistant:

PiecewiseConstant1D(pstd::span<const Float> f, Float min, Float max,
                        Allocator alloc = {})
        : func(f.begin(), f.end(), alloc), cdf(f.size() + 1, alloc), min(min), max(max) {
        CHECK_GT(max, min);
        // Take absolute value of _func_
        for (Float &f : func)
            f = std::abs(f);

        // Compute integral of step function at $x_i$
        cdf[0] = 0;
        size_t n = f.size();
        for (size_t i = 1; i < n + 1; ++i) {
            CHECK_GE(func[i - 1], 0);
            cdf[i] = cdf[i - 1] + func[i - 1] * (max - min) / n;
        }

        // Transform step function integral into CDF
        funcInt = cdf[n];
        if (funcInt == 0)
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] = Float(i) / Float(n);
        else
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] /= funcInt;
    }